

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall HighsSparseMatrix::scaleRow(HighsSparseMatrix *this,HighsInt row,double rowScale)

{
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  if (this->format_ == kColwise) {
    piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar6 = (ulong)(uint)this->num_col_;
    if (this->num_col_ < 1) {
      uVar6 = uVar7;
    }
    while (uVar7 != uVar6) {
      piVar1 = piVar3 + uVar7;
      iVar2 = piVar3[uVar7 + 1];
      uVar7 = uVar7 + 1;
      piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar8 = (long)*piVar1; lVar8 < iVar2; lVar8 = lVar8 + 1) {
        if (piVar4[lVar8] == row) {
          pdVar5[lVar8] = pdVar5[lVar8] * rowScale;
        }
      }
    }
  }
  else {
    piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = piVar3[(long)row + 1];
    for (lVar8 = (long)piVar3[row]; lVar8 < iVar2; lVar8 = lVar8 + 1) {
      pdVar5[lVar8] = pdVar5[lVar8] * rowScale;
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}